

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

Image * __thiscall
Image::transformLinear(Image *__return_storage_ptr__,Image *this,int s_min,int s_max)

{
  uint row;
  uint uVar1;
  int **ppiVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  Image *pIVar6;
  undefined4 row_00;
  undefined8 matrix;
  int **ppiVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uStack_70;
  int aiStack_68 [2];
  Image *local_60;
  undefined1 *local_58;
  undefined1 local_50 [8];
  Image result;
  
  row = this->row;
  result.row = this->maxGray;
  if ((s_max | s_min) < 0) {
    s_min = result.row;
    if ((int)row < 1) {
      s_max = 0;
    }
    else {
      uVar9 = 0;
      s_max = 0;
      do {
        if (0 < this->col) {
          uVar11 = 0;
          do {
            iVar8 = this->matrix[uVar9][uVar11];
            if (s_max < iVar8) {
              s_max = iVar8;
            }
            if (iVar8 < s_min) {
              s_min = iVar8;
            }
            uVar11 = uVar11 + 1;
          } while ((uint)this->col != uVar11);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != row);
    }
  }
  local_50._4_4_ = this->col;
  uStack_70 = 0x1036c1;
  local_60 = __return_storage_ptr__;
  local_50._0_4_ = row;
  result.matrix._0_4_ = result.row;
  result.matrix._4_4_ = local_50._4_4_;
  ppiVar7 = clone_matrix<int>(this->matrix,row,local_50._4_4_);
  local_58 = (undefined1 *)aiStack_68;
  result._8_8_ = ppiVar7;
  lVar5 = -((ulong)(this->maxGray + 1) * 4 + 0xf & 0xfffffffffffffff0);
  uVar1 = this->maxGray;
  if (-1 < (int)uVar1) {
    auVar14._0_8_ = (long)(int)uVar1;
    auVar14._8_4_ = uVar1;
    auVar14._12_4_ = (int)uVar1 >> 0x1f;
    iVar8 = (1 - s_min) * uVar1;
    iVar10 = -(s_min * uVar1);
    lVar12 = 0;
    auVar14 = auVar14 ^ _DAT_001060c0;
    auVar15 = _DAT_001060b0;
    do {
      auVar16 = auVar15 ^ _DAT_001060c0;
      if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                  auVar14._4_4_ < auVar16._4_4_) & 1)) {
        *(int *)((long)aiStack_68 + lVar12 + lVar5 + -0x68 + 0x68) = iVar10 / (s_max - s_min);
      }
      if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
          auVar16._12_4_ <= auVar14._12_4_) {
        *(int *)((long)aiStack_68 + lVar12 + lVar5 + 4) = iVar8 / (s_max - s_min);
      }
      lVar13 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar13 + 2;
      lVar12 = lVar12 + 8;
      iVar8 = iVar8 + uVar1 * 2;
      iVar10 = iVar10 + uVar1 * 2;
    } while ((ulong)(uVar1 >> 1 & 0x3fffffff) * 8 + 8 != lVar12);
  }
  pIVar6 = local_60;
  iVar8 = this->row;
  if (0 < iVar8) {
    ppiVar2 = this->matrix;
    uVar9 = (ulong)(uint)this->col;
    lVar12 = 0;
    do {
      if (0 < (int)uVar9) {
        piVar3 = ppiVar2[lVar12];
        piVar4 = ppiVar7[lVar12];
        lVar13 = 0;
        do {
          piVar4[lVar13] =
               *(int *)((long)aiStack_68 + (long)piVar3[lVar13] * 4 + lVar5 + -0x68 + 0x68);
          lVar13 = lVar13 + 1;
          uVar9 = (ulong)this->col;
        } while (lVar13 < (long)uVar9);
        iVar8 = this->row;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar8);
  }
  *(undefined8 *)((long)aiStack_68 + lVar5 + -8) = 0x103801;
  normalize((Image *)local_50);
  iVar8 = result.matrix._4_4_;
  pIVar6->row = row;
  pIVar6->col = result.matrix._4_4_;
  pIVar6->maxGray = (int)result.matrix;
  *(undefined8 *)((long)aiStack_68 + lVar5 + -8) = 0x10381b;
  ppiVar7 = clone_matrix<int>(ppiVar7,row,iVar8);
  matrix = result._8_8_;
  row_00 = local_50._0_4_;
  pIVar6->matrix = ppiVar7;
  *(undefined8 *)(local_58 + -8) = 0x10382f;
  free_matrix<int>((int **)matrix,row_00);
  return pIVar6;
}

Assistant:

Image Image::transformLinear(int s_min, int s_max)
{
    if(s_min < 0 || s_max < 0)
    {
        s_min=maxGray, s_max=0;
        for (int i = 0; i < row; ++i) {
            for (int j = 0; j < col; ++j) {
                if(matrix[i][j] > s_max)
                    s_max = matrix[i][j];
                if(matrix[i][j] < s_min)
                    s_min = matrix[i][j];
            }
        }
    }

    Image result = clone();
    int LUT[maxGray+1];

    for(int i=0; i<=maxGray; ++i)
    {
        LUT[i] = maxGray*(i - s_min)/(s_max - s_min);
    }

    for (int i = 0; i < row; ++i) {
        for (int j = 0; j < col; ++j) {
            result.matrix[i][j] = LUT[matrix[i][j]];
        }
    }

    return result.normalize();
}